

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# context.c
# Opt level: O0

exr_context_initializer_t * fill_context_data(exr_context_initializer_t *ctxtdata)

{
  ulong *in_RSI;
  exr_context_initializer_t *in_RDI;
  exr_context_initializer_t *inits;
  
  memset(in_RDI,0,0x68);
  in_RDI->size = 0x68;
  in_RDI->zip_level = -2;
  in_RDI->dwa_quality = -1.0;
  if (in_RSI != (ulong *)0x0) {
    in_RDI->error_handler_fn = (exr_error_handler_cb_t)in_RSI[1];
    in_RDI->alloc_fn = (exr_memory_allocation_func_t)in_RSI[2];
    in_RDI->free_fn = (exr_memory_free_func_t)in_RSI[3];
    in_RDI->user_data = (void *)in_RSI[4];
    in_RDI->read_fn = (exr_read_func_ptr_t)in_RSI[5];
    in_RDI->size_fn = (exr_query_size_func_ptr_t)in_RSI[6];
    in_RDI->write_fn = (exr_write_func_ptr_t)in_RSI[7];
    in_RDI->destroy_fn = (exr_destroy_stream_func_ptr_t)in_RSI[8];
    in_RDI->max_image_width = (int)in_RSI[9];
    in_RDI->max_image_height = *(int *)((long)in_RSI + 0x4c);
    in_RDI->max_tile_width = (int)in_RSI[10];
    in_RDI->max_tile_height = *(int *)((long)in_RSI + 0x54);
    if (0x5f < *in_RSI) {
      in_RDI->zip_level = (int)in_RSI[0xb];
      in_RDI->dwa_quality = *(float *)((long)in_RSI + 0x5c);
    }
    if (0x67 < *in_RSI) {
      in_RDI->flags = (int)in_RSI[0xc];
    }
  }
  internal_exr_update_default_handlers(in_RDI);
  return in_RDI;
}

Assistant:

static inline exr_context_initializer_t
fill_context_data (const exr_context_initializer_t* ctxtdata)
{
    exr_context_initializer_t inits = EXR_DEFAULT_CONTEXT_INITIALIZER;
    if (ctxtdata)
    {
        inits.error_handler_fn = ctxtdata->error_handler_fn;
        inits.alloc_fn         = ctxtdata->alloc_fn;
        inits.free_fn          = ctxtdata->free_fn;
        inits.user_data        = ctxtdata->user_data;
        inits.read_fn          = ctxtdata->read_fn;
        inits.size_fn          = ctxtdata->size_fn;
        inits.write_fn         = ctxtdata->write_fn;
        inits.destroy_fn       = ctxtdata->destroy_fn;
        inits.max_image_width  = ctxtdata->max_image_width;
        inits.max_image_height = ctxtdata->max_image_height;
        inits.max_tile_width   = ctxtdata->max_tile_width;
        inits.max_tile_height  = ctxtdata->max_tile_height;
        if (ctxtdata->size >= sizeof (struct _exr_context_initializer_v2))
        {
            inits.zip_level   = ctxtdata->zip_level;
            inits.dwa_quality = ctxtdata->dwa_quality;
        }
        if (ctxtdata->size >= sizeof (struct _exr_context_initializer_v3))
        {
            inits.flags = ctxtdata->flags;
        }
    }

    internal_exr_update_default_handlers (&inits);
    return inits;
}